

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O1

int ptm_mgau_frame_eval(ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,
                       int32 n_senone_active,mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  uint *puVar1;
  ulong uVar2;
  int *piVar3;
  int *piVar4;
  byte bVar5;
  byte bVar6;
  short sVar7;
  uint uVar8;
  void *__s;
  mfcc_t *pmVar9;
  long lVar10;
  undefined8 uVar11;
  float *pfVar12;
  int *piVar13;
  float *pfVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  char **ppcVar19;
  long lVar20;
  long *plVar21;
  byte *pbVar22;
  long lVar23;
  int iVar24;
  size_t __n;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  float *pfVar28;
  int iVar29;
  char **ppcVar30;
  float *pfVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  float *pfVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  int *piVar39;
  long lVar40;
  mfcc_t *pmVar41;
  float *pfVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  long local_70;
  
  iVar29 = *(int *)&ps[6].vt;
  iVar24 = frame % iVar29;
  ppcVar30 = &(ps[5].vt)->name + (long)iVar24 * 2;
  *(char ***)&ps[5].frame_idx = ppcVar30;
  if (ps->frame_idx <= frame) {
    ppcVar19 = &(ps[5].vt)->name + (long)iVar29 * 2;
    if (iVar24 != 0) {
      ppcVar19 = ppcVar30;
    }
    memcpy((void *)**(undefined8 **)*ppcVar30,(void *)**(undefined8 **)ppcVar19[-2],
           (long)(short)ps[4].frame_idx *
           (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24) *
           (long)*(int *)(*(long *)&ps[1].frame_idx + 0x20) * 8);
    iVar24 = *(int *)(*(long *)&ps[1].frame_idx + 0x20);
    iVar29 = iVar24 + 0x1f;
    iVar24 = iVar24 + 0x3e;
    if (-1 < iVar29) {
      iVar24 = iVar29;
    }
    __n = (long)(iVar24 >> 5) << 2;
    __s = *(void **)(*(long *)&ps[5].frame_idx + 8);
    if (compallsen == 0) {
      uVar25 = 0;
      memset(__s,0,__n);
      if (0 < n_senone_active) {
        lVar20 = *(long *)&ps[2].frame_idx;
        lVar34 = *(long *)(*(long *)&ps[5].frame_idx + 8);
        uVar33 = 0;
        do {
          uVar25 = (uVar25 & 0xffffffff) + (ulong)senone_active[uVar33];
          bVar5 = *(byte *)(lVar20 + uVar25);
          puVar1 = (uint *)(lVar34 + (ulong)(bVar5 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << (bVar5 & 0x1f);
          uVar33 = uVar33 + 1;
        } while ((uint)n_senone_active != uVar33);
      }
    }
    else {
      memset(__s,0xff,__n);
    }
    if (0 < *(int *)(*(long *)&ps[1].frame_idx + 0x20)) {
      lVar20 = 0;
      do {
        lVar34 = *(long *)&ps[1].frame_idx;
        if (0 < *(int *)(lVar34 + 0x24)) {
          lVar23 = 0;
          do {
            if (0 < (short)ps[4].frame_idx) {
              pmVar9 = featbuf[lVar23];
              lVar10 = *(long *)(*(long *)(**(long **)&ps[5].frame_idx + lVar20 * 8) + lVar23 * 8);
              iVar29 = *(int *)(*(long *)(lVar34 + 0x30) + lVar23 * 4);
              iVar32 = iVar29 % 4;
              iVar24 = 0;
              if (0 < iVar32) {
                iVar24 = iVar32;
              }
              lVar34 = 0;
              do {
                iVar18 = *(int *)(lVar10 + lVar34 * 8);
                plVar21 = *(long **)&ps[1].frame_idx;
                fVar43 = *(float *)(*(long *)(*(long *)(plVar21[2] + lVar20 * 8) + lVar23 * 8) +
                                   (long)iVar18 * 4);
                lVar36 = (long)(iVar18 * iVar29) * 4;
                lVar27 = **(long **)(*(long *)(*plVar21 + lVar20 * 8) + lVar23 * 8) + lVar36;
                lVar36 = lVar36 + **(long **)(*(long *)(plVar21[1] + lVar20 * 8) + lVar23 * 8);
                if (iVar32 < 1) {
                  iVar18 = 0;
                  pmVar41 = pmVar9;
                }
                else {
                  lVar37 = 0;
                  lVar40 = 0;
                  do {
                    fVar44 = (float)pmVar9[lVar40] - *(float *)(lVar27 + lVar40 * 4);
                    fVar43 = fVar43 - fVar44 * fVar44 * *(float *)(lVar36 + lVar40 * 4);
                    lVar40 = lVar40 + 1;
                    lVar37 = lVar37 + -4;
                  } while (iVar32 != (int)lVar40);
                  lVar36 = lVar36 - lVar37;
                  lVar27 = lVar27 - lVar37;
                  pmVar41 = (mfcc_t *)((long)pmVar9 - lVar37);
                  iVar18 = iVar32;
                }
                if (iVar18 < iVar29) {
                  lVar37 = 0;
                  do {
                    fVar44 = (float)pmVar41[lVar37] - *(float *)(lVar27 + lVar37 * 4);
                    fVar46 = (float)pmVar41[lVar37 + 1] - *(float *)(lVar27 + 4 + lVar37 * 4);
                    fVar47 = (float)pmVar41[lVar37 + 2] - *(float *)(lVar27 + 8 + lVar37 * 4);
                    fVar45 = (float)pmVar41[lVar37 + 3] - *(float *)(lVar27 + 0xc + lVar37 * 4);
                    fVar43 = (((fVar43 - fVar44 * fVar44 * *(float *)(lVar36 + lVar37 * 4)) -
                              fVar46 * fVar46 * *(float *)(lVar36 + 4 + lVar37 * 4)) -
                             fVar47 * fVar47 * *(float *)(lVar36 + 8 + lVar37 * 4)) -
                             fVar45 * fVar45 * *(float *)(lVar36 + 0xc + lVar37 * 4);
                    lVar37 = lVar37 + 4;
                  } while (iVar24 + (int)lVar37 < iVar29);
                }
                if (-2.1474836e+09 <= fVar43) {
                  *(int *)(lVar10 + 4 + lVar34 * 8) = (int)fVar43;
                  if (lVar34 != 0) {
                    uVar11 = *(undefined8 *)(lVar10 + lVar34 * 8);
                    lVar27 = lVar34;
                    do {
                      if ((int)fVar43 <= *(int *)(lVar10 + -4 + lVar27 * 8)) goto LAB_0013ffa2;
                      *(undefined8 *)(lVar10 + lVar27 * 8) =
                           *(undefined8 *)(lVar10 + -8 + lVar27 * 8);
                      bVar15 = 1 < lVar27;
                      lVar27 = lVar27 + -1;
                    } while (bVar15);
                    lVar27 = 0;
LAB_0013ffa2:
                    *(undefined8 *)(lVar10 + (long)(int)lVar27 * 8) = uVar11;
                  }
                }
                else {
                  *(undefined4 *)(lVar10 + 4 + lVar34 * 8) = 0x80000000;
                }
                lVar34 = lVar34 + 1;
              } while (lVar34 < (short)ps[4].frame_idx);
            }
            lVar23 = lVar23 + 1;
            lVar34 = *(long *)&ps[1].frame_idx;
          } while (lVar23 < *(int *)(lVar34 + 0x24));
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < *(int *)(*(long *)&ps[1].frame_idx + 0x20));
    }
    if ((frame % (int)*(short *)((long)&ps[4].frame_idx + 2) == 0) &&
       (0 < *(int *)(*(long *)&ps[1].frame_idx + 0x20))) {
      uVar25 = 0;
      do {
        if (((*(uint *)(*(long *)(*(long *)&ps[5].frame_idx + 8) + (uVar25 >> 5 & 0x7ffffff) * 4) >>
              ((uint)uVar25 & 0x1f) & 1) != 0) &&
           (plVar21 = *(long **)&ps[1].frame_idx, 0 < *(int *)((long)plVar21 + 0x24))) {
          local_70 = 0;
          do {
            lVar20 = plVar21[5];
            if (0 < (long)(int)lVar20) {
              pfVar12 = (float *)featbuf[local_70];
              piVar13 = *(int **)(*(long *)(**(long **)&ps[5].frame_idx + uVar25 * 8) + local_70 * 8
                                 );
              lVar34 = (long)(short)ps[4].frame_idx;
              piVar4 = piVar13 + lVar34 * 2 + -2;
              pfVar14 = *(float **)(*(long *)(plVar21[2] + uVar25 * 8) + local_70 * 8);
              iVar29 = *(int *)(plVar21[6] + local_70 * 4);
              pfVar28 = (float *)**(long **)(*(long *)(plVar21[1] + uVar25 * 8) + local_70 * 8);
              pfVar42 = (float *)**(long **)(*(long *)(*plVar21 + uVar25 * 8) + local_70 * 8);
              pfVar35 = pfVar14;
              do {
                iVar24 = 0;
                fVar43 = *pfVar35;
                fVar44 = (float)piVar13[lVar34 * 2 + -1];
                pfVar31 = pfVar12;
                if ((0 < iVar29 % 4) && (fVar44 <= fVar43)) {
                  iVar24 = 0;
                  do {
                    fVar45 = *pfVar31;
                    pfVar31 = pfVar31 + 1;
                    fVar46 = *pfVar42;
                    pfVar42 = pfVar42 + 1;
                    fVar47 = *pfVar28;
                    pfVar28 = pfVar28 + 1;
                    fVar43 = fVar43 - (fVar45 - fVar46) * (fVar45 - fVar46) * fVar47;
                    iVar24 = iVar24 + 1;
                    if (iVar29 % 4 <= iVar24) break;
                  } while (fVar44 <= fVar43);
                }
                bVar15 = iVar24 < iVar29;
                if (iVar24 < iVar29) {
                  while (fVar44 <= fVar43) {
                    fVar43 = (((fVar43 - (*pfVar31 - *pfVar42) * (*pfVar31 - *pfVar42) * *pfVar28) -
                              (pfVar31[1] - pfVar42[1]) * (pfVar31[1] - pfVar42[1]) * pfVar28[1]) -
                             (pfVar31[2] - pfVar42[2]) * (pfVar31[2] - pfVar42[2]) * pfVar28[2]) -
                             (pfVar31[3] - pfVar42[3]) * (pfVar31[3] - pfVar42[3]) * pfVar28[3];
                    pfVar28 = pfVar28 + 4;
                    pfVar42 = pfVar42 + 4;
                    iVar24 = iVar24 + 4;
                    bVar15 = iVar24 < iVar29;
                    if (iVar29 <= iVar24) break;
                    pfVar31 = pfVar31 + 4;
                  }
                }
                if (bVar15) {
                  pfVar42 = pfVar42 + (iVar29 - iVar24);
                  pfVar28 = pfVar28 + (iVar29 - iVar24);
                }
                else if (fVar44 <= fVar43) {
                  uVar33 = (ulong)(short)ps[4].frame_idx;
                  iVar24 = (int)((ulong)((long)pfVar35 - (long)pfVar14) >> 2);
                  if ((long)uVar33 < 1) {
LAB_0014021b:
                    if (-2.1474836e+09 <= fVar43) {
                      piVar39 = piVar13 + lVar34 * 2 + -4;
                      for (piVar3 = piVar4; (piVar13 <= piVar39 && (piVar3[-1] <= (int)fVar43));
                          piVar3 = piVar3 + -2) {
                        *(undefined8 *)piVar3 = *(undefined8 *)(piVar3 + -2);
                        piVar39 = piVar3 + -4;
                      }
                      *piVar3 = iVar24;
                      piVar3[1] = (int)fVar43;
                    }
                    else {
                      *piVar4 = iVar24;
                      piVar4[1] = -0x80000000;
                    }
                  }
                  else if (*piVar13 != iVar24) {
                    uVar38 = 0;
                    do {
                      if (uVar33 - 1 == uVar38) goto LAB_0014021b;
                      uVar2 = uVar38 + 1;
                      lVar23 = uVar38 * 2;
                      uVar38 = uVar2;
                    } while (piVar13[lVar23 + 2] != iVar24);
                    if (uVar33 <= uVar2) goto LAB_0014021b;
                  }
                }
                pfVar35 = pfVar35 + 1;
              } while (pfVar35 < pfVar14 + (int)lVar20);
            }
            local_70 = local_70 + 1;
            plVar21 = *(long **)&ps[1].frame_idx;
          } while (local_70 < *(int *)((long)plVar21 + 0x24));
        }
        uVar25 = uVar25 + 1;
      } while ((long)uVar25 < (long)*(int *)(*(long *)&ps[1].frame_idx + 0x20));
    }
    lVar20 = *(long *)&ps[1].frame_idx;
    if (0 < *(int *)(lVar20 + 0x24)) {
      lVar34 = 0;
      do {
        uVar25 = (ulong)*(int *)(lVar20 + 0x20);
        if ((long)uVar25 < 1) {
          iVar29 = -0x20000000;
        }
        else {
          iVar29 = -0x20000000;
          uVar33 = 0;
          do {
            if (((*(uint *)((*(long **)&ps[5].frame_idx)[1] + (uVar33 >> 5 & 0x7ffffff) * 4) >>
                  ((uint)uVar33 & 0x1f) & 1) != 0) &&
               (iVar24 = *(int *)(*(long *)(*(long *)(**(long **)&ps[5].frame_idx + uVar33 * 8) +
                                           lVar34 * 8) + 4) >> 10, iVar29 <= iVar24)) {
              iVar29 = iVar24;
            }
            uVar33 = uVar33 + 1;
          } while (uVar25 != uVar33);
        }
        if (0 < *(int *)(lVar20 + 0x20)) {
          uVar33 = 0;
          do {
            plVar21 = *(long **)&ps[5].frame_idx;
            if (((*(uint *)(plVar21[1] + (uVar33 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar33 & 0x1f) & 1
                 ) != 0) && (0 < (short)ps[4].frame_idx)) {
              lVar20 = 0;
              do {
                lVar23 = *(long *)(*(long *)(*plVar21 + uVar33 * 8) + lVar34 * 8);
                iVar24 = iVar29 - (*(int *)(lVar23 + 4 + lVar20 * 8) >> 10);
                if (0x5f < iVar24) {
                  iVar24 = 0x60;
                }
                *(int *)(lVar23 + 4 + lVar20 * 8) = iVar24;
                lVar20 = lVar20 + 1;
              } while (lVar20 < (short)ps[4].frame_idx);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != uVar25);
        }
        lVar34 = lVar34 + 1;
        lVar20 = *(long *)&ps[1].frame_idx;
      } while (lVar34 < *(int *)(lVar20 + 0x24));
    }
  }
  memset(senone_scores,0,(long)*(int *)&ps[2].vt * 2);
  if (compallsen != 0) {
    n_senone_active = *(int32 *)&ps[2].vt;
  }
  if (n_senone_active < 1) {
    iVar29 = 0xffff;
  }
  else {
    lVar20 = *(long *)&ps[2].frame_idx;
    plVar21 = *(long **)&ps[5].frame_idx;
    lVar34 = plVar21[1];
    uVar8 = *(uint *)(*(long *)&ps[1].frame_idx + 0x24);
    iVar29 = 0x7fffffff;
    uVar25 = 0;
    iVar24 = 0;
    do {
      iVar32 = (int)uVar25;
      if (compallsen == 0) {
        iVar32 = iVar24 + (uint)senone_active[uVar25];
      }
      iVar24 = iVar32;
      lVar23 = (long)iVar24;
      bVar5 = *(byte *)(lVar20 + lVar23);
      if (((*(uint *)(lVar34 + (ulong)(bVar5 >> 5) * 4) >> (bVar5 & 0x1f) & 1) == 0) &&
         (0 < (int)uVar8)) {
        sVar7 = (short)ps[4].frame_idx;
        uVar33 = 0;
        do {
          if (0 < sVar7) {
            lVar10 = *(long *)(*(long *)(*plVar21 + (ulong)bVar5 * 8) + uVar33 * 8);
            lVar27 = 0;
            do {
              *(undefined4 *)(lVar10 + 4 + lVar27 * 8) = 0x60;
              lVar27 = lVar27 + 1;
            } while (sVar7 != lVar27);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar8);
      }
      if ((int)uVar8 < 1) {
        iVar32 = 0;
      }
      else {
        sVar7 = (short)ps[4].frame_idx;
        uVar33 = 0;
        iVar32 = 0;
        do {
          iVar18 = 0;
          if (0 < sVar7) {
            lVar10 = *(long *)(*(long *)(*plVar21 + (ulong)bVar5 * 8) + uVar33 * 8);
            lVar27 = 0;
            iVar18 = 0;
            do {
              lVar36 = *(long *)((&(ps[3].vt)->name)[uVar33] +
                                (long)*(int *)(lVar10 + lVar27 * 8) * 8);
              if (ps[4].vt == (ps_mgaufuncs_t *)0x0) {
                pbVar22 = (byte *)(lVar36 + lVar23);
              }
              else {
                bVar6 = *(byte *)(lVar36 + iVar24 / 2);
                uVar26 = bVar6 & 0xf;
                if ((bVar6 & 1) != 0) {
                  uVar26 = (uint)(bVar6 >> 4);
                }
                pbVar22 = (byte *)((long)&(ps[4].vt)->name + (ulong)uVar26);
              }
              if (lVar27 == 0) {
                iVar18 = (uint)*pbVar22 + *(int *)(lVar10 + 4);
              }
              else {
                iVar17 = (uint)*pbVar22 + *(int *)(lVar10 + 4 + lVar27 * 8);
                uVar26 = iVar18 - iVar17;
                if (iVar18 < iVar17) {
                  iVar17 = iVar18;
                }
                uVar16 = -uVar26;
                if (0 < (int)uVar26) {
                  uVar16 = uVar26;
                }
                iVar18 = iVar17 - (uint)*(byte *)(**(long **)&ps[6].frame_idx + (ulong)uVar16);
              }
              lVar27 = lVar27 + 1;
            } while (sVar7 != lVar27);
          }
          iVar32 = iVar32 + iVar18;
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar8);
      }
      if (iVar32 < iVar29) {
        iVar29 = iVar32;
      }
      senone_scores[lVar23] = (int16)iVar32;
      uVar25 = uVar25 + 1;
    } while (uVar25 != (uint)n_senone_active);
  }
  iVar24 = *(int *)&ps[2].vt;
  if (0 < (long)iVar24) {
    lVar20 = 0;
    do {
      senone_scores[lVar20] = senone_scores[lVar20] - (short)iVar29;
      lVar20 = lVar20 + 1;
    } while (iVar24 != lVar20);
  }
  return 0;
}

Assistant:

int32
ptm_mgau_frame_eval(ps_mgau_t *ps,
                    int16 *senone_scores,
                    uint8 *senone_active,
                    int32 n_senone_active,
                    mfcc_t ** featbuf, int32 frame,
                    int32 compallsen)
{
    ptm_mgau_t *s = (ptm_mgau_t *)ps;
    int fast_eval_idx;

    /* Find the appropriate frame in the rotating history buffer
     * corresponding to the requested input frame.  No bounds checking
     * is done here, which just means you'll get semi-random crap if
     * you request a frame in the future or one that's too far in the
     * past.  Since the history buffer is just used for fast match
     * that might not be fatal. */
    fast_eval_idx = frame % s->n_fast_hist;
    s->f = s->hist + fast_eval_idx;
    /* Compute the top-N codewords for every codebook, unless this
     * is a past frame, in which case we already have them (we
     * hope!) */
    if (frame >= ps_mgau_base(ps)->frame_idx) {
        ptm_fast_eval_t *lastf;
        /* Get the previous frame's top-N information (on the
         * first frame of the input this is just all WORST_DIST,
         * no harm in that) */
        if (fast_eval_idx == 0)
            lastf = s->hist + s->n_fast_hist - 1;
        else
            lastf = s->hist + fast_eval_idx - 1;
        /* Copy in initial top-N info */
        memcpy(s->f->topn[0][0], lastf->topn[0][0],
               s->g->n_mgau * s->g->n_feat * s->max_topn * sizeof(ptm_topn_t));
        /* Generate initial active codebook list (this might not be
         * necessary) */
        ptm_mgau_calc_cb_active(s, senone_active, n_senone_active, compallsen);
        /* Now evaluate top-N, prune, and evaluate remaining codebooks. */
        ptm_mgau_codebook_eval(s, featbuf, frame);
        ptm_mgau_codebook_norm(s, featbuf, frame);
    }
    /* Evaluate intersection of active senones and active codebooks. */
    ptm_mgau_senone_eval(s, senone_scores, senone_active,
                         n_senone_active, compallsen);

    return 0;
}